

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenVectorForceAlign
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field,string *field_size)

{
  BaseType BVar1;
  StructDef *def;
  uint uVar2;
  Value *pVVar3;
  char *__rhs;
  Type vtype;
  allocator<char> local_191;
  undefined1 local_190 [32];
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 != BASE_TYPE_VECTOR) && (BVar1 != BASE_TYPE_VECTOR64)) {
    __assert_fail("IsVector(field.value.type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                  ,0xb8b,
                  "std::string flatbuffers::cpp::CppGenerator::GenVectorForceAlign(const FieldDef &, const std::string &)"
                 );
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"force_align",(allocator<char> *)&local_150);
  pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                     (&(field->super_Definition).attributes,(string *)local_190);
  std::__cxx11::string::~string((string *)local_190);
  if ((pVVar3 != (Value *)0x0) &&
     (uVar2 = atoi((pVVar3->constant)._M_dataplus._M_p), 1 < (int)uVar2)) {
    local_190._0_4_ = (field->value).type.element;
    def = (field->value).type.struct_def;
    local_190._16_8_ = (field->value).type.enum_def;
    local_190._24_2_ = (field->value).type.fixed_length;
    local_190._4_4_ = BASE_TYPE_NONE;
    local_190._8_8_ = def;
    if ((local_190._0_4_ == BASE_TYPE_STRUCT) && (def->fixed == true)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"",(allocator<char> *)&local_130);
      BaseGenerator::WrapInNameSpace
                (&local_150,&this->super_BaseGenerator,&def->super_Definition,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
    else {
      GenTypeWire_abi_cxx11_(&local_150,this,(Type *)local_190,"",false,field->offset64);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"_fbb.ForceVectorAlignment",&local_191);
    __rhs = "";
    if (field->offset64 != false) {
      __rhs = "64";
    }
    std::operator+(&local_d0,&local_f0,__rhs);
    std::operator+(&local_b0,&local_d0,"(");
    std::operator+(&local_90,&local_b0,field_size);
    std::operator+(&local_70,&local_90,", sizeof(");
    std::operator+(&local_50,&local_70,&local_150);
    std::operator+(&local_130,&local_50,"), ");
    std::__cxx11::to_string(&local_110,(ulong)uVar2);
    std::operator+(&local_170,&local_130,&local_110);
    std::operator+(__return_storage_ptr__,&local_170,");");
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_150);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string GenVectorForceAlign(const FieldDef &field,
                                  const std::string &field_size) {
    FLATBUFFERS_ASSERT(IsVector(field.value.type));
    // Get the value of the force_align attribute.
    const auto *force_align = field.attributes.Lookup("force_align");
    const int align = force_align ? atoi(force_align->constant.c_str()) : 1;
    // Generate code to do force_align for the vector.
    if (align > 1) {
      const auto vtype = field.value.type.VectorType();
      const std::string &type =
          IsStruct(vtype) ? WrapInNameSpace(*vtype.struct_def)
                          : GenTypeWire(vtype, "", false, field.offset64);
      return std::string("_fbb.ForceVectorAlignment") +
             (field.offset64 ? "64" : "") + "(" + field_size + ", sizeof(" +
             type + "), " + std::to_string(static_cast<long long>(align)) +
             ");";
    }
    return "";
  }